

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxRawSocket.cpp
# Opt level: O2

void __thiscall LinuxRawSocket::~LinuxRawSocket(LinuxRawSocket *this)

{
  ~LinuxRawSocket(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

LinuxRawSocket::~LinuxRawSocket()
{
    PosixSocketCommon::shutdown(socket_fd);
}